

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

VmFrame * VmNewFrame(jx9_vm *pVm,void *pUserData)

{
  VmFrame *pFrame;
  void *pUserData_local;
  jx9_vm *pVm_local;
  
  pVm_local = (jx9_vm *)SyMemBackendPoolAlloc(&pVm->sAllocator,0xb0);
  if (pVm_local == (jx9_vm *)0x0) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    SyZero(pVm_local,0xb0);
    (pVm_local->sAllocator).pMethods = (SyMemMethods *)pUserData;
    *(jx9_vm **)&(pVm_local->sAllocator).nMagic = pVm;
    SyHashInit((SyHash *)(pVm_local->sAllocator).apPool,&pVm->sAllocator,(ProcHash)0x0,(ProcCmp)0x0)
    ;
    SySetInit((SySet *)((pVm_local->sAllocator).apPool + 8),&pVm->sAllocator,0x10);
    SySetInit((SySet *)&(pVm_local->sAllocator).pBlocks,&pVm->sAllocator,0x10);
  }
  return (VmFrame *)pVm_local;
}

Assistant:

static VmFrame * VmNewFrame(
	jx9_vm *pVm,              /* Target VM */
	void *pUserData          /* Upper-layer private data */
	)
{
	VmFrame *pFrame;
	/* Allocate a new vm frame */
	pFrame = (VmFrame *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(VmFrame));
	if( pFrame == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pFrame, sizeof(VmFrame));
	/* Initialize frame fields */
	pFrame->pUserData = pUserData;
	pFrame->pVm = pVm;
	SyHashInit(&pFrame->hVar, &pVm->sAllocator, 0, 0);
	SySetInit(&pFrame->sArg, &pVm->sAllocator, sizeof(VmSlot));
	SySetInit(&pFrame->sLocal, &pVm->sAllocator, sizeof(VmSlot));
	return pFrame;
}